

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rep.cpp
# Opt level: O1

int __thiscall zmq::rep_t::xsend(rep_t *this,msg_t *msg_)

{
  byte bVar1;
  int iVar2;
  int *piVar3;
  
  if ((this->super_router_t).field_0x84c == '\0') {
    piVar3 = __errno_location();
    *piVar3 = 0x9523dfb;
    iVar2 = -1;
  }
  else {
    bVar1 = msg_t::flags(msg_);
    iVar2 = router_t::xsend(&this->super_router_t,msg_);
    if ((iVar2 == 0) && (iVar2 = 0, (bVar1 & 1) == 0)) {
      (this->super_router_t).field_0x84c = 0;
    }
  }
  return iVar2;
}

Assistant:

int zmq::rep_t::xsend (msg_t *msg_)
{
    //  If we are in the middle of receiving a request, we cannot send reply.
    if (!_sending_reply) {
        errno = EFSM;
        return -1;
    }

    const bool more = (msg_->flags () & msg_t::more) != 0;

    //  Push message to the reply pipe.
    const int rc = router_t::xsend (msg_);
    if (rc != 0)
        return rc;

    //  If the reply is complete flip the FSM back to request receiving state.
    if (!more)
        _sending_reply = false;

    return 0;
}